

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>::evaluate
          (IVal *__return_storage_ptr__,Expr<tcu::Matrix<float,_2,_2>_> *this,EvalContext *ctx)

{
  EvalContext *ctx_local;
  Expr<tcu::Matrix<float,_2,_2>_> *this_local;
  
  (*(this->super_ExprBase)._vptr_ExprBase[4])(__return_storage_ptr__,this,ctx);
  return __return_storage_ptr__;
}

Assistant:

typename Traits<T>::IVal Expr<T>::evaluate (const EvalContext& ctx) const
{
#ifdef GLS_ENABLE_TRACE
	static const FloatFormat	highpFmt	(-126, 127, 23, true,
											 tcu::MAYBE,
											 tcu::YES,
											 tcu::MAYBE);
	EvalContext					newCtx		(ctx.format, ctx.floatPrecision,
											 ctx.env, ctx.callDepth + 1);
	const IVal					ret			= this->doEvaluate(newCtx);

	if (isTypeValid<T>())
	{
		std::cerr << string(ctx.callDepth, ' ');
		this->printExpr(std::cerr);
		std::cerr << " -> " << intervalToString<T>(highpFmt, ret) << std::endl;
	}
	return ret;
#else
	return this->doEvaluate(ctx);
#endif
}